

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_buffer_encoder.c
# Opt level: O0

uint64_t lzma_block_buffer_bound64(uint64_t uncompressed_size)

{
  uint64_t uVar1;
  uint64_t lzma2_size;
  uint64_t uncompressed_size_local;
  
  uVar1 = lzma2_bound(uncompressed_size);
  if (uVar1 == 0) {
    uncompressed_size_local = 0;
  }
  else {
    uncompressed_size_local = (uVar1 + 3 & 0xfffffffffffffffc) + 0x5c;
  }
  return uncompressed_size_local;
}

Assistant:

extern uint64_t
lzma_block_buffer_bound64(uint64_t uncompressed_size)
{
	// If the data doesn't compress, we always use uncompressed
	// LZMA2 chunks.
	uint64_t lzma2_size = lzma2_bound(uncompressed_size);
	if (lzma2_size == 0)
		return 0;

	// Take Block Padding into account.
	lzma2_size = (lzma2_size + 3) & ~UINT64_C(3);

	// No risk of integer overflow because lzma2_bound() already takes
	// into account the size of the headers in the Block.
	return HEADERS_BOUND + lzma2_size;
}